

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void TypeCheck_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  ktypeattr_t kVar1;
  kNameSpace *block;
  KClass *pKVar2;
  _func_void_char_ptr_char_ptr_int_char_ptr_varargs *p_Var3;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var4;
  undefined4 uVar5;
  kString *pkVar6;
  uintptr_t uVar7;
  kNameSpace *pkVar8;
  size_t sVar9;
  uint uVar10;
  kNameSpace *ns;
  
  block = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar2 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar8 = block;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar2) break;
    pkVar8 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar8->packageId)->RootNodeNameSpace;
    ns = pkVar8;
  } while ((pkVar8->h).ct != pKVar2);
  pKVar2 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_Block",0x6d,"tracing..");
  uVar10 = 0xffffffff;
  if (((block->importedNameSpaceList->h).ct)->baseTypeId == 6) {
    uVar10 = (int)(block->importedNameSpaceList->bytesize >> 3) - 1;
  }
  kVar1 = pKVar2->typeId;
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)block,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
             ,"TypeCheckBlock",0xf6);
  p_Var3 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
  sVar9 = (ns->genv->localScope).varsize;
  pkVar6 = (*kctx->klib->KClass_shortName)(kctx,pKVar2);
  p_Var4 = ((pkVar6->h).ct)->unbox;
  pkVar6 = (*kctx->klib->KClass_shortName)(kctx,pKVar2);
  uVar7 = (*p_Var4)(kctx,(kObject_conflict *)pkVar6);
  (*p_Var3)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
            ,"TypeCheckBlock",0xf7,">>>>>>>> size=%d, varsize=%d, reqc=%s",(ulong)uVar10,sVar9,uVar7
           );
  if (0 < (int)uVar10) {
    sVar9 = 0;
    do {
      pkVar8 = (kNameSpace *)
               TypeCheckNodeList(kctx,(kNode *)block,sVar9,ns,
                                 *(kctx->share->classTable).field_1.classItems);
      if ((*(int *)&pkVar8->parentNULL == 0x18) && (kVar1 == 0)) {
        pkVar8 = block;
        if (*(int *)&block->parentNULL == 0x18) goto LAB_00115141;
        goto LAB_001150b5;
      }
      if (*(int *)&pkVar8->parentNULL == 0x18) goto LAB_00115141;
      sVar9 = sVar9 + 1;
    } while (uVar10 != sVar9);
  }
  if ((int)uVar10 < 0) {
    uVar5 = 0;
    if (*(int *)&block->parentNULL != 0x18) {
LAB_001150cc:
      *(undefined4 *)&block->parentNULL = 0xd;
      *(undefined4 *)((long)&block->parentNULL + 4) = uVar5;
    }
  }
  else {
    pkVar8 = (kNameSpace *)TypeCheckNodeList(kctx,(kNode *)block,(ulong)uVar10,ns,pKVar2);
    if (*(int *)&pkVar8->parentNULL == 0x18) {
      if ((kVar1 == 0) && (pkVar8 = block, *(int *)&block->parentNULL != 0x18)) {
LAB_001150b5:
        block->parentNULL = (kNameSpace *)0xd;
        pkVar8 = block;
      }
      goto LAB_00115141;
    }
    if (*(int *)&block->parentNULL != 0x18) {
      uVar5 = *(undefined4 *)((long)&pkVar8->parentNULL + 4);
      goto LAB_001150cc;
    }
  }
  p_Var3 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
  pkVar6 = KType_GetString(kctx,*(uint *)((long)&block->parentNULL + 4) & 0xfffffff);
  p_Var4 = ((pkVar6->h).ct)->unbox;
  pkVar6 = KType_GetString(kctx,*(uint *)((long)&block->parentNULL + 4) & 0xfffffff);
  uVar7 = (*p_Var4)(kctx,(kObject_conflict *)pkVar6);
  (*p_Var3)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
            ,"TypeCheckBlock",0x109,">>>>>>>> size=%d, typed=%s",(ulong)uVar10,uVar7);
  pkVar8 = block;
LAB_00115141:
  sfp[-4].field_0.asNode = (kNode *)pkVar8;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	KReturn(TypeCheckBlock(kctx, expr, ns, reqc));
}